

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Clear(CodeGeneratorResponse *this)

{
  ulong uVar1;
  anon_union_56_1_493b367e_for_CodeGeneratorResponse_10 aVar2;
  undefined8 *puVar3;
  LogMessageFatal LStack_18;
  
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
            (&(this->field_0)._impl_.file_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x20);
    if ((uVar1 & 3) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
                 ,0x20b,"!tagged_ptr_.IsDefault()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0xe) != (undefined1  [56])0x0) {
    (this->field_0)._impl_.supported_features_ = 0;
    *(undefined8 *)((long)&this->field_0 + 0x30) = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void CodeGeneratorResponse::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.file_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.error_.ClearNonDefaultToEmpty();
  }
  if ((cached_has_bits & 0x0000000eu) != 0) {
    ::memset(&_impl_.supported_features_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.maximum_edition_) -
        reinterpret_cast<char*>(&_impl_.supported_features_)) + sizeof(_impl_.maximum_edition_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}